

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O1

AGLProgram aGLProgramCreate(char **vertex,char **fragment)

{
  GLuint GVar1;
  GLuint GVar2;
  AGLProgram AVar3;
  GLint status;
  int local_1c;
  
  GVar1 = a__GLCreateShader(0x8b30,fragment);
  if (GVar1 == 0) {
    AVar3 = -1;
  }
  else {
    GVar2 = a__GLCreateShader(0x8b31,vertex);
    if (GVar2 == 0) {
      glDeleteShader(GVar1);
      AVar3 = -2;
    }
    else {
      AVar3 = glCreateProgram();
      glAttachShader(AVar3,GVar1);
      glAttachShader(AVar3,GVar2);
      glLinkProgram(AVar3);
      glDeleteShader(GVar1);
      glDeleteShader(GVar2);
      glGetProgramiv(AVar3,0x8b82,&local_1c);
      if (local_1c != 1) {
        glGetProgramInfoLog(AVar3,0x400,0,a_gl_error);
        glDeleteProgram(AVar3);
        AVar3 = -3;
      }
    }
  }
  return AVar3;
}

Assistant:

GLint aGLProgramCreate(const char *const *vertex, const char *const *fragment) {
	GLuint program;
	GLuint vertex_shader, fragment_shader;
	fragment_shader = a__GLCreateShader(GL_FRAGMENT_SHADER, fragment);
	if (fragment_shader == 0)
		return -1;

	vertex_shader = a__GLCreateShader(GL_VERTEX_SHADER, vertex);
	if (vertex_shader == 0) {
		AGL__CALL(glDeleteShader(fragment_shader));
		return -2;
	}

	program = glCreateProgram();
	AGL__CALL(glAttachShader(program, fragment_shader));
	AGL__CALL(glAttachShader(program, vertex_shader));
	AGL__CALL(glLinkProgram(program));

	AGL__CALL(glDeleteShader(fragment_shader));
	AGL__CALL(glDeleteShader(vertex_shader));

	{
		GLint status;
		AGL__CALL(glGetProgramiv(program, GL_LINK_STATUS, &status));
		if (status != GL_TRUE) {
			AGL__CALL(glGetProgramInfoLog(program, sizeof(a_gl_error), 0, a_gl_error));
			AGL__CALL(glDeleteProgram(program));
			return -3;
		}
	}

	return program;
}